

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture_extraction.hpp
# Opt level: O0

Image4u * eos::render::extract_texture
                    (Image4u *__return_storage_ptr__,Mesh *mesh,Matrix4f *view_model_matrix,
                    Matrix4f *projection_matrix,ProjectionType projection_type,Image4u *image,
                    int texturemap_resolution)

{
  float clip_coord_y;
  float fVar1;
  bool bVar2;
  bool bVar3;
  const_reference cVar4;
  int screen_height;
  int iVar5;
  size_type sVar6;
  size_type sVar7;
  value_type *pvVar8;
  const_reference this;
  const_reference pvVar9;
  DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *pDVar10;
  CoeffReturnType pfVar11;
  DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *pDVar12;
  Scalar *pSVar13;
  Scalar *pSVar14;
  Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0> PVar15;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *local_400;
  byte local_349;
  optional<eos::render::Texture> local_348;
  float local_320;
  float local_31c;
  double local_318;
  double local_310;
  double local_308;
  double local_300;
  undefined1 local_2f8 [8];
  Vertex<double> pc;
  float local_2a0;
  float local_29c;
  double local_298;
  double local_290;
  double local_288;
  double local_280;
  undefined1 local_278 [8];
  Vertex<double> pb;
  float local_220;
  float local_21c;
  double local_218;
  double local_210;
  double local_208;
  double local_200;
  undefined1 local_1f8 [8];
  Vertex<double> pa;
  value_type *tti;
  value_type *tvi;
  size_t triangle_index;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *mesh_tti;
  int tex_height;
  int tex_width;
  Vector2f screen_coords;
  Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0> local_168;
  Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0> local_160;
  Product<Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>,_0>
  local_150;
  undefined1 local_138 [8];
  Vector4f clip_coords;
  Matrix<float,_3,_1,_0,_3,_1> *vtx;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  *__range2;
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  wnd_coords;
  vector<bool,_std::allocator<bool>_> per_vertex_visibility;
  RayDirection ray_direction_type;
  undefined1 local_b8 [8];
  Texture image_to_extract_from_as_tex;
  Rasterizer<eos::render::ExtractionFragmentShader> extraction_rasterizer;
  Image4u *image_local;
  ProjectionType projection_type_local;
  Matrix4f *projection_matrix_local;
  Matrix4f *view_model_matrix_local;
  Mesh *mesh_local;
  
  extraction_rasterizer.depthbuffer.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)image;
  sVar6 = std::
          vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
          ::size(&mesh->vertices);
  sVar7 = std::
          vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
          ::size(&mesh->texcoords);
  local_349 = 1;
  if (sVar6 != sVar7) {
    bVar2 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::empty
                      (&mesh->tti);
    local_349 = bVar2 ^ 0xff;
  }
  if ((local_349 & 1) == 0) {
    __assert_fail("mesh.vertices.size() == mesh.texcoords.size() || !mesh.tti.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/render/texture_extraction.hpp"
                  ,0x4d,
                  "eos::core::Image4u eos::render::extract_texture(const core::Mesh &, Eigen::Matrix4f, Eigen::Matrix4f, ProjectionType, const eos::core::Image4u &, int)"
                 );
  }
  bVar3 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::empty
                    (&mesh->tti);
  bVar2 = true;
  if (!bVar3) {
    sVar6 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::size
                      (&mesh->tti);
    sVar7 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::size
                      (&mesh->tvi);
    bVar2 = sVar6 == sVar7;
  }
  if (!bVar2) {
    __assert_fail("mesh.tti.empty() || mesh.tti.size() == mesh.tvi.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/render/texture_extraction.hpp"
                  ,0x4f,
                  "eos::core::Image4u eos::render::extract_texture(const core::Mesh &, Eigen::Matrix4f, Eigen::Matrix4f, ProjectionType, const eos::core::Image4u &, int)"
                 );
  }
  Rasterizer<eos::render::ExtractionFragmentShader>::Rasterizer
            ((Rasterizer<eos::render::ExtractionFragmentShader> *)
             &image_to_extract_from_as_tex.widthLog,texturemap_resolution,texturemap_resolution);
  create_mipmapped_texture
            ((Texture *)local_b8,
             (Image4u *)
             extraction_rasterizer.depthbuffer.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,1);
  image_to_extract_from_as_tex.heightLog = '\0';
  image_to_extract_from_as_tex._26_1_ = 0;
  per_vertex_visibility.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage._1_3_ = 0;
  per_vertex_visibility.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage._0_1_ = projection_type != Orthographic;
  compute_per_vertex_self_occlusion
            ((vector<bool,_std::allocator<bool>_> *)
             &wnd_coords.
              super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&mesh->vertices,&mesh->tvi,
             view_model_matrix,
             (RayDirection)
             per_vertex_visibility.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_end_of_storage);
  std::
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  ::vector((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
            *)&__range2);
  __end2 = std::
           vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
           ::begin(&mesh->vertices);
  vtx = (Matrix<float,_3,_1,_0,_3,_1> *)
        std::
        vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ::end(&mesh->vertices);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
                                *)&vtx);
    if (!bVar2) break;
    clip_coords.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array.
    _8_8_ = __gnu_cxx::
            __normal_iterator<const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
            ::operator*(&__end2);
    PVar15 = Eigen::MatrixBase<Eigen::Matrix<float,4,4,0,4,4>>::operator*
                       ((MatrixBase<Eigen::Matrix<float,4,4,0,4,4>> *)projection_matrix,
                        (MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)view_model_matrix);
    local_160 = PVar15;
    local_168.m_matrix =
         (Nested)Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::homogeneous
                           ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                            clip_coords.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                            m_storage.m_data.array._8_8_);
    Eigen::operator*(&local_150,
                     (MatrixBase<Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                      *)&local_160,&local_168);
    Eigen::Matrix<float,4,1,0,4,1>::
    Matrix<Eigen::Product<Eigen::Product<Eigen::Matrix<float,4,4,0,4,4>,Eigen::Matrix<float,4,4,0,4,4>,0>,Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>,0>>
              ((Matrix<float,4,1,0,4,1> *)local_138,
               (EigenBase<Eigen::Product<Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>,_0>_>
                *)&local_150);
    detail::divide_by_w<float>((detail *)&screen_coords,(Vector4<float> *)local_138);
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
              ((Matrix<float,_4,_1,_0,_4,_1> *)local_138,
               (Matrix<float,_4,_1,_0,_4,_1> *)&screen_coords);
    pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x
                        ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)local_138);
    fVar1 = *pSVar13;
    pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y
                        ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)local_138);
    clip_coord_y = *pSVar13;
    iVar5 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::width
                      ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                       extraction_rasterizer.depthbuffer.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    screen_height =
         core::Image<eos::core::Pixel<unsigned_char,_4>_>::height
                   ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                    extraction_rasterizer.depthbuffer.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    clip_to_screen_space<float>((render *)&tex_height,fVar1,clip_coord_y,iVar5,screen_height);
    pfVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::x
                        ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)&tex_height);
    fVar1 = *pfVar11;
    pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x
                        ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)local_138);
    *pSVar13 = fVar1;
    pfVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::y
                        ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)&tex_height);
    fVar1 = *pfVar11;
    pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y
                        ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)local_138);
    *pSVar13 = fVar1;
    std::
    vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
    ::push_back((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                 *)&__range2,(value_type *)local_138);
    __gnu_cxx::
    __normal_iterator<const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
    ::operator++(&__end2);
  }
  bVar2 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::empty
                    (&mesh->tti);
  if (bVar2) {
    local_400 = &mesh->tvi;
  }
  else {
    local_400 = &mesh->tti;
  }
  tvi = (value_type *)0x0;
  while( true ) {
    pvVar8 = (value_type *)
             std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::size
                       (&mesh->tvi);
    if (pvVar8 <= tvi) break;
    this = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::operator[]
                     (&mesh->tvi,(size_type)tvi);
    pa.texcoords.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
    [1] = (double)std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::
                  operator[](local_400,(size_type)tvi);
    pvVar9 = std::array<int,_3UL>::operator[](this,0);
    cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)
                       &wnd_coords.
                        super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)*pvVar9);
    if (cVar4) {
      pvVar9 = std::array<int,_3UL>::operator[](this,1);
      cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)
                         &wnd_coords.
                          super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)*pvVar9);
      if (cVar4) {
        pvVar9 = std::array<int,_3UL>::operator[](this,2);
        cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)
                           &wnd_coords.
                            super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)*pvVar9);
        if (cVar4) {
          pvVar9 = std::array<int,_3UL>::operator[]
                             ((array<int,_3UL> *)
                              pa.texcoords.
                              super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage
                              .m_data.array[1],0);
          pDVar10 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                    std::
                    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    ::operator[](&mesh->texcoords,(long)*pvVar9);
          pfVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                              (pDVar10,0);
          local_200 = (double)(*pfVar11 * (float)texturemap_resolution);
          pvVar9 = std::array<int,_3UL>::operator[]
                             ((array<int,_3UL> *)
                              pa.texcoords.
                              super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage
                              .m_data.array[1],0);
          pDVar10 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                    std::
                    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    ::operator[](&mesh->texcoords,(long)*pvVar9);
          pfVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                              (pDVar10,1);
          local_208 = (double)(*pfVar11 * (float)texturemap_resolution);
          pvVar9 = std::array<int,_3UL>::operator[](this,0);
          pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                    std::
                    vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                    ::operator[]((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                  *)&__range2,(long)*pvVar9);
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::z(pDVar12);
          local_210 = (double)*pSVar13;
          pvVar9 = std::array<int,_3UL>::operator[](this,0);
          pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                    std::
                    vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                    ::operator[]((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                  *)&__range2,(long)*pvVar9);
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::w(pDVar12);
          local_218 = (double)*pSVar13;
          Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix
                    ((Matrix<double,_4,_1,_0,_4,_1> *)local_1f8,&local_200,&local_208,&local_210,
                     &local_218);
          Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                    ((Matrix<double,_3,_1,_0,_3,_1> *)
                     (pa.position.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                      m_storage.m_data.array + 3));
          pvVar9 = std::array<int,_3UL>::operator[](this,0);
          pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                    std::
                    vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                    ::operator[]((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                  *)&__range2,(long)*pvVar9);
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x(pDVar12);
          fVar1 = *pSVar13;
          iVar5 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::width
                            ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                             extraction_rasterizer.depthbuffer.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
          local_21c = fVar1 / (float)iVar5;
          pvVar9 = std::array<int,_3UL>::operator[](this,0);
          pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                    std::
                    vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                    ::operator[]((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                  *)&__range2,(long)*pvVar9);
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y(pDVar12);
          fVar1 = *pSVar13;
          iVar5 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::height
                            ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                             extraction_rasterizer.depthbuffer.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
          local_220 = fVar1 / (float)iVar5;
          Eigen::Matrix<double,2,1,0,2,1>::Matrix<float,float>
                    ((Matrix<double,2,1,0,2,1> *)&pa.field_0x38,&local_21c,&local_220);
          pvVar9 = std::array<int,_3UL>::operator[]
                             ((array<int,_3UL> *)
                              pa.texcoords.
                              super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage
                              .m_data.array[1],1);
          pDVar10 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                    std::
                    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    ::operator[](&mesh->texcoords,(long)*pvVar9);
          pfVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                              (pDVar10,0);
          local_280 = (double)(*pfVar11 * (float)texturemap_resolution);
          pvVar9 = std::array<int,_3UL>::operator[]
                             ((array<int,_3UL> *)
                              pa.texcoords.
                              super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage
                              .m_data.array[1],1);
          pDVar10 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                    std::
                    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    ::operator[](&mesh->texcoords,(long)*pvVar9);
          pfVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                              (pDVar10,1);
          local_288 = (double)(*pfVar11 * (float)texturemap_resolution);
          pvVar9 = std::array<int,_3UL>::operator[](this,1);
          pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                    std::
                    vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                    ::operator[]((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                  *)&__range2,(long)*pvVar9);
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::z(pDVar12);
          local_290 = (double)*pSVar13;
          pvVar9 = std::array<int,_3UL>::operator[](this,1);
          pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                    std::
                    vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                    ::operator[]((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                  *)&__range2,(long)*pvVar9);
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::w(pDVar12);
          local_298 = (double)*pSVar13;
          Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix
                    ((Matrix<double,_4,_1,_0,_4,_1> *)local_278,&local_280,&local_288,&local_290,
                     &local_298);
          Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                    ((Matrix<double,_3,_1,_0,_3,_1> *)
                     (pb.position.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                      m_storage.m_data.array + 3));
          pvVar9 = std::array<int,_3UL>::operator[](this,1);
          pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                    std::
                    vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                    ::operator[]((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                  *)&__range2,(long)*pvVar9);
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x(pDVar12);
          fVar1 = *pSVar13;
          iVar5 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::width
                            ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                             extraction_rasterizer.depthbuffer.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
          local_29c = fVar1 / (float)iVar5;
          pvVar9 = std::array<int,_3UL>::operator[](this,1);
          pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                    std::
                    vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                    ::operator[]((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                  *)&__range2,(long)*pvVar9);
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y(pDVar12);
          fVar1 = *pSVar13;
          iVar5 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::height
                            ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                             extraction_rasterizer.depthbuffer.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
          local_2a0 = fVar1 / (float)iVar5;
          Eigen::Matrix<double,2,1,0,2,1>::Matrix<float,float>
                    ((Matrix<double,2,1,0,2,1> *)&pb.field_0x38,&local_29c,&local_2a0);
          pvVar9 = std::array<int,_3UL>::operator[]
                             ((array<int,_3UL> *)
                              pa.texcoords.
                              super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage
                              .m_data.array[1],2);
          pDVar10 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                    std::
                    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    ::operator[](&mesh->texcoords,(long)*pvVar9);
          pfVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                              (pDVar10,0);
          local_300 = (double)(*pfVar11 * (float)texturemap_resolution);
          pvVar9 = std::array<int,_3UL>::operator[]
                             ((array<int,_3UL> *)
                              pa.texcoords.
                              super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage
                              .m_data.array[1],2);
          pDVar10 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                    std::
                    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    ::operator[](&mesh->texcoords,(long)*pvVar9);
          pfVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                              (pDVar10,1);
          local_308 = (double)(*pfVar11 * (float)texturemap_resolution);
          pvVar9 = std::array<int,_3UL>::operator[](this,2);
          pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                    std::
                    vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                    ::operator[]((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                  *)&__range2,(long)*pvVar9);
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::z(pDVar12);
          local_310 = (double)*pSVar13;
          pvVar9 = std::array<int,_3UL>::operator[](this,2);
          pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                    std::
                    vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                    ::operator[]((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                  *)&__range2,(long)*pvVar9);
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::w(pDVar12);
          local_318 = (double)*pSVar13;
          Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix
                    ((Matrix<double,_4,_1,_0,_4,_1> *)local_2f8,&local_300,&local_308,&local_310,
                     &local_318);
          Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                    ((Matrix<double,_3,_1,_0,_3,_1> *)
                     (pc.position.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                      m_storage.m_data.array + 3));
          pvVar9 = std::array<int,_3UL>::operator[](this,2);
          pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                    std::
                    vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                    ::operator[]((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                  *)&__range2,(long)*pvVar9);
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x(pDVar12);
          fVar1 = *pSVar13;
          iVar5 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::width
                            ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                             extraction_rasterizer.depthbuffer.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
          local_31c = fVar1 / (float)iVar5;
          pvVar9 = std::array<int,_3UL>::operator[](this,2);
          pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                    std::
                    vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                    ::operator[]((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                  *)&__range2,(long)*pvVar9);
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y(pDVar12);
          fVar1 = *pSVar13;
          iVar5 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::height
                            ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                             extraction_rasterizer.depthbuffer.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
          local_320 = fVar1 / (float)iVar5;
          Eigen::Matrix<double,2,1,0,2,1>::Matrix<float,float>
                    ((Matrix<double,2,1,0,2,1> *)&pc.field_0x38,&local_31c,&local_320);
          pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::x
                              ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                               &pa.field_0x38);
          if (0.0 < *pSVar14 || *pSVar14 == 0.0) {
            pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::x
                                ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                                 &pa.field_0x38);
            if (*pSVar14 <= 1.0) {
              pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::y
                                  ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                                   &pa.field_0x38);
              if (0.0 < *pSVar14 || *pSVar14 == 0.0) {
                pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::y
                                    ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                                     &pa.field_0x38);
                if (*pSVar14 <= 1.0) {
                  pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::x
                                      ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                                       &pb.field_0x38);
                  if (0.0 < *pSVar14 || *pSVar14 == 0.0) {
                    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::x
                                        ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *
                                         )&pb.field_0x38);
                    if (*pSVar14 <= 1.0) {
                      pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::y
                                          ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>
                                            *)&pb.field_0x38);
                      if (0.0 < *pSVar14 || *pSVar14 == 0.0) {
                        pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::y
                                            ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>
                                              *)&pb.field_0x38);
                        if (*pSVar14 <= 1.0) {
                          pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>
                                    ::x((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                                        &pc.field_0x38);
                          if (0.0 < *pSVar14 || *pSVar14 == 0.0) {
                            pSVar14 = Eigen::
                                      DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::x
                                                ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>
                                                  *)&pc.field_0x38);
                            if (*pSVar14 <= 1.0) {
                              pSVar14 = Eigen::
                                        DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::y
                                                  ((
                                                  DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>
                                                  *)&pc.field_0x38);
                              if (0.0 < *pSVar14 || *pSVar14 == 0.0) {
                                pSVar14 = Eigen::
                                          DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::
                                          y((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>
                                             *)&pc.field_0x38);
                                if (*pSVar14 <= 1.0) {
                                  std::optional<eos::render::Texture>::
                                  optional<eos::render::Texture_&,_true>
                                            (&local_348,(Texture *)local_b8);
                                  Rasterizer<eos::render::ExtractionFragmentShader>::
                                  raster_triangle<double>
                                            ((Rasterizer<eos::render::ExtractionFragmentShader> *)
                                             &image_to_extract_from_as_tex.widthLog,
                                             (Vertex<double> *)local_1f8,(Vertex<double> *)local_278
                                             ,(Vertex<double> *)local_2f8,&local_348);
                                  std::optional<eos::render::Texture>::~optional(&local_348);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    tvi = (value_type *)((long)tvi->_M_elems + 1);
  }
  core::Image<eos::core::Pixel<unsigned_char,_4>_>::Image
            (__return_storage_ptr__,
             (Image<eos::core::Pixel<unsigned_char,_4>_> *)&extraction_rasterizer.viewport_height);
  std::
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  ::~vector((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
             *)&__range2);
  std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)
             &wnd_coords.
              super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Texture::~Texture((Texture *)local_b8);
  Rasterizer<eos::render::ExtractionFragmentShader>::~Rasterizer
            ((Rasterizer<eos::render::ExtractionFragmentShader> *)
             &image_to_extract_from_as_tex.widthLog);
  return __return_storage_ptr__;
}

Assistant:

inline eos::core::Image4u extract_texture(const core::Mesh& mesh, Eigen::Matrix4f view_model_matrix,
                                          Eigen::Matrix4f projection_matrix, ProjectionType projection_type,
                                          const eos::core::Image4u& image, int texturemap_resolution = 512)
{
    // Assert that either there are texture coordinates given for each vertex (in which case the texture map
    // doesn't contain any seams), or that a separate list of texture triangle indices is given (i.e. mesh.tti
    // is not empty):
    assert(mesh.vertices.size() == mesh.texcoords.size() || !mesh.tti.empty());
    // Sanity check on the texture triangle indices: They should be either empty or equal to tvi.size():
    assert(mesh.tti.empty() || mesh.tti.size() == mesh.tvi.size());

    using detail::divide_by_w;
    using detail::RayDirection;
    using Eigen::Vector2f;
    using Eigen::Vector2d;
    using Eigen::Vector3f;
    using Eigen::Vector3d;
    using Eigen::Vector4f;
    using Eigen::Vector4d;
    using std::vector;
    // We only need a rasteriser to remap the texture, not the complete SoftwareRenderer:
    Rasterizer<ExtractionFragmentShader> extraction_rasterizer(texturemap_resolution, texturemap_resolution);
    Texture image_to_extract_from_as_tex = create_mipmapped_texture(image, 1);
    extraction_rasterizer.enable_depth_test = false; // We don't need to depth-test in the rendered image (which is the texture map).
    extraction_rasterizer.perspective_correct_barycentric_weights = false; // We want the uncorrected lambda be passed to our shader

    // For the per-vertex view angle, and the self-occlusion tests, we have to know the projection type, and
    // then use different vector directions depending on the projection type:
    RayDirection ray_direction_type;
    if (projection_type == ProjectionType::Orthographic)
    {
        ray_direction_type = RayDirection::Parallel;
    } else
    {
        ray_direction_type = RayDirection::TowardsOrigin;
    }

    // Test for self-occlusion, i.e. whether each vertex is visible from
    // the camera origin:
    const vector<bool> per_vertex_visibility = compute_per_vertex_self_occlusion(
        mesh.vertices, mesh.tvi, view_model_matrix, ray_direction_type);

    vector<Vector4f> wnd_coords; // will contain [x_wnd, y_wnd, z_ndc, 1/w_clip]
    for (auto&& vtx : mesh.vertices)
    {
        Vector4f clip_coords = projection_matrix * view_model_matrix * vtx.homogeneous();
        clip_coords = divide_by_w(clip_coords);
        // Note: We could make use of a new `viewport` parameter here, to allow any viewport transformations.
        const Vector2f screen_coords =
            clip_to_screen_space(clip_coords.x(), clip_coords.y(), image.width(), image.height());
        clip_coords.x() = screen_coords.x(); // Todo: Can simplify this...?
        clip_coords.y() = screen_coords.y();
        wnd_coords.push_back(clip_coords);
    }

    // Go on with extracting: This only needs the rasteriser/FS, not the whole Renderer.
    const int tex_width = texturemap_resolution;
    const int tex_height =
        texturemap_resolution; // keeping this in case we need non-square texture maps at some point

    // Use Mesh::tti as texture triangle indices if present, tvi otherwise:
    const auto& mesh_tti = mesh.tti.empty() ? mesh.tvi : mesh.tti;

    for (std::size_t triangle_index = 0; triangle_index < mesh.tvi.size(); ++triangle_index)
    {
        // Select the three indices for the current triangle:
        const auto& tvi = mesh.tvi[triangle_index];
        const auto& tti = mesh_tti[triangle_index];

        // Check if all three vertices of the current triangle are visible, and use the triangle if so:
        if (per_vertex_visibility[tvi[0]] && per_vertex_visibility[tvi[1]] &&
            per_vertex_visibility[tvi[2]]) // can also try using ||, but...
        {
            // The model's texcoords become the locations to extract to in the framebuffer (which is the
            // texture map we're extracting to). The wnd_coords are the coordinates we're extracting from (the
            // original image), which from the perspective of the rasteriser, is the texture map, and thus
            // from the rasteriser's perspective they're the texture coords.
            //
            // (Note: A test with a rendered & re-extracted texture showed that we're off by a pixel or more,
            //  definitely need to correct this. Probably here. It looks like it is 1-2 pixels off. Definitely
            //  a bit more than 1.)
            detail::Vertex<double> pa{
                Vector4d(mesh.texcoords[tti[0]][0] * tex_width,
					 mesh.texcoords[tti[0]][1] * tex_height,
                     wnd_coords[tvi[0]].z(), // z_ndc
                     wnd_coords[tvi[0]].w()), // 1/w_clip
                Vector3d(),                       // empty
                Vector2d(wnd_coords[tvi[0]].x() / image.width(),
                     wnd_coords[tvi[0]].y() /
                         image.height() // (maybe '1 - wndcoords...'?) wndcoords of the projected/rendered
                                        // model triangle (in the input img). Normalised to 0,1.
					)};
            detail::Vertex<double> pb{
                Vector4d(mesh.texcoords[tti[1]][0] * tex_width,
				mesh.texcoords[tti[1]][1] * tex_height,
                     wnd_coords[tvi[1]].z(), // z_ndc
                     wnd_coords[tvi[1]].w()), // 1/w_clip
                Vector3d(),                       // empty
                Vector2d(wnd_coords[tvi[1]].x() / image.width(),
                     wnd_coords[tvi[1]].y() /
                         image.height() // (maybe '1 - wndcoords...'?) wndcoords of the projected/rendered
                                        // model triangle (in the input img). Normalised to 0,1.
					)};
            detail::Vertex<double> pc{
                Vector4d(mesh.texcoords[tti[2]][0] * tex_width,
				mesh.texcoords[tti[2]][1] * tex_height,
                     wnd_coords[tvi[2]].z(), // z_ndc
				wnd_coords[tvi[2]].w()), // 1/w_clip
                Vector3d(),                       // empty
                Vector2d(wnd_coords[tvi[2]].x() / image.width(),
                     wnd_coords[tvi[2]].y() /
                         image.height() // (maybe '1 - wndcoords...'?) wndcoords of the projected/rendered
                                        // model triangle (in the input img). Normalised to 0,1.
					)};
            // The wnd_coords (now p[a|b|c].texcoords) can actually be outside the image, if the head is
            // outside the image. Just skip the whole triangle if that is the case:
            if (pa.texcoords.x() < 0 || pa.texcoords.x() > 1 || pa.texcoords.y() < 0 || pa.texcoords.y() > 1 ||
                pb.texcoords.x() < 0 || pb.texcoords.x() > 1 || pb.texcoords.y() < 0 || pb.texcoords.y() > 1 ||
                pc.texcoords.x() < 0 || pc.texcoords.x() > 1 || pc.texcoords.y() < 0 || pc.texcoords.y() > 1)
            {
                continue;
            }
            extraction_rasterizer.raster_triangle(pa, pb, pc, image_to_extract_from_as_tex);
        }
    }

    return extraction_rasterizer.colorbuffer;
}